

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall rengine::OpenGLRenderer::render(OpenGLRenderer *this,Element *first,Element *last)

{
  char cVar1;
  uint uVar2;
  long *plVar3;
  vec2 *pvVar4;
  vec2 renderSize;
  vec2 textureSize;
  mat4 o;
  mat4 matrix;
  GLuint GVar5;
  Format format;
  long lVar6;
  mat4 *pmVar7;
  float *pfVar8;
  undefined4 *puVar9;
  undefined8 *puVar10;
  mat4 *this_00;
  undefined8 *puVar11;
  TexturePool *this_01;
  BlurNode *blurNode;
  Element *pEVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  float fVar16;
  float in_stack_fffffffffffffe08 [16];
  float local_1a8 [2];
  mat4 storedProj;
  undefined8 local_120 [8];
  uint local_e0;
  vec2 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  float local_9c;
  undefined8 local_98;
  undefined4 local_90;
  float local_8c;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  mat4 *local_60;
  vec2 local_58;
  undefined8 uStack_50;
  float local_3c;
  TexturePool *local_38;
  
  bVar15 = 0;
  pEVar12 = first;
  if (first < last && this->m_numLayeredNodes != 0) {
    do {
      if ((pEVar12->field_0x1b & 0x40) != 0) {
        renderToLayer(this,pEVar12);
        pEVar12 = pEVar12 + (*(uint *)&pEVar12->field_0x18 & 0x1fffffff);
      }
      pEVar12 = pEVar12 + 1;
    } while (pEVar12 < last);
  }
  glViewport(0,0,(int)(this->m_surfaceSize).x,(int)(this->m_surfaceSize).y);
  if (first < last) {
    local_60 = &this->m_proj;
    local_38 = &this->m_texturePool;
    do {
      this_00 = local_60;
      uVar2 = *(uint *)((long)first + 0x18);
      if ((int)uVar2 < 0) goto LAB_00122612;
      plVar3 = *(long **)first;
      cVar1 = (char)plVar3[6];
      switch(cVar1) {
      case '\x02':
        if ((uVar2 < 0x40000000) || (*(uint *)((long)first + 0x10) == 0)) break;
        drawTextureQuad(this,*(uint *)((long)first + 8),*(uint *)((long)first + 0x10),
                        *(float *)((long)plVar3 + 0x34),RGBA_32);
LAB_0012248e:
        GVar5 = *(uint *)((long)first + 0x10);
        this_01 = local_38;
LAB_00122496:
        TexturePool::release(this_01,GVar5);
        goto LAB_0012260d;
      case '\x03':
        if ((0x3fffffff < uVar2) && (GVar5 = *(uint *)((long)first + 0x10), GVar5 != 0)) {
          uVar2 = *(uint *)((long)first + 8);
          puVar9 = (undefined4 *)((long)plVar3 + 0x34);
          puVar10 = local_120;
          for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(undefined4 *)puVar10 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar15 * -2 + 1;
            puVar10 = (undefined8 *)((long)puVar10 + (ulong)bVar15 * -8 + 4);
          }
          puVar10 = local_120;
          puVar11 = (undefined8 *)&stack0xfffffffffffffe08;
          for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar11 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
          }
          matrix.type = local_e0;
          matrix.m[0] = in_stack_fffffffffffffe08[0];
          matrix.m[1] = in_stack_fffffffffffffe08[1];
          matrix.m[2] = in_stack_fffffffffffffe08[2];
          matrix.m[3] = in_stack_fffffffffffffe08[3];
          matrix.m[4] = in_stack_fffffffffffffe08[4];
          matrix.m[5] = in_stack_fffffffffffffe08[5];
          matrix.m[6] = in_stack_fffffffffffffe08[6];
          matrix.m[7] = in_stack_fffffffffffffe08[7];
          matrix.m[8] = in_stack_fffffffffffffe08[8];
          matrix.m[9] = in_stack_fffffffffffffe08[9];
          matrix.m[10] = in_stack_fffffffffffffe08[10];
          matrix.m[0xb] = in_stack_fffffffffffffe08[0xb];
          matrix.m[0xc] = in_stack_fffffffffffffe08[0xc];
          matrix.m[0xd] = in_stack_fffffffffffffe08[0xd];
          matrix.m[0xe] = in_stack_fffffffffffffe08[0xe];
          matrix.m[0xf] = in_stack_fffffffffffffe08[0xf];
          drawColorFilterQuad(this,uVar2,GVar5,matrix);
          goto LAB_0012248e;
        }
        break;
      case '\x04':
        if ((0x3fffffff < uVar2) && (*(uint *)((long)first + 0x10) != 0)) {
          uVar2 = *(uint *)((long)first + 8);
          pvVar4 = this->m_vertices;
          fVar16 = pvVar4[uVar2 + 0xb].y - pvVar4[uVar2 + 8].y;
          renderSize.y = fVar16;
          renderSize.x = pvVar4[uVar2 + 0xb].x - pvVar4[uVar2 + 8].x;
          textureSize.y = pvVar4[uVar2 + 7].y - pvVar4[uVar2 + 4].y;
          textureSize.x = pvVar4[uVar2 + 7].x - pvVar4[uVar2 + 4].x;
          drawBlurQuad(this,uVar2 + 8,*(uint *)((long)first + 0x10),*(int *)((long)plVar3 + 0x34),
                       renderSize,textureSize,(vec2)((ulong)(uint)(1.0 / fVar16) << 0x20));
          goto LAB_0012248e;
        }
        break;
      case '\x05':
        if ((0x3fffffff < uVar2) && (*(uint *)((long)first + 0x10) != 0)) {
          uVar2 = *(uint *)((long)first + 8);
          pvVar4 = this->m_vertices;
          local_58.y = pvVar4[uVar2 + 7].y - pvVar4[uVar2 + 4].y;
          local_58.x = pvVar4[uVar2 + 7].x - pvVar4[uVar2 + 4].x;
          uStack_50 = 0;
          local_c8 = pvVar4[uVar2 + 0xb].y - pvVar4[uVar2 + 8].y;
          local_d8.y = local_c8;
          local_d8.x = pvVar4[uVar2 + 0xb].x - pvVar4[uVar2 + 8].x;
          uStack_d0 = 0;
          pmVar7 = local_60;
          pfVar8 = local_1a8;
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
            *pfVar8 = pmVar7->m[0];
            pmVar7 = (mat4 *)((long)pmVar7 + (ulong)bVar15 * -8 + 4);
            pfVar8 = pfVar8 + (ulong)bVar15 * -2 + 1;
          }
          local_b8 = plVar3[7];
          uStack_b0 = 0;
          local_3c = roundf((float)local_b8);
          local_8c = roundf(local_b8._4_4_);
          local_a8 = 0x3f800000;
          local_a0 = 0;
          local_9c = local_3c;
          local_98 = 0x3f80000000000000;
          local_90 = 0;
          local_88 = 0;
          local_80 = 0x3f800000;
          local_7c = 0;
          uStack_74 = 0;
          local_6c = 0x13f800000;
          puVar10 = &local_a8;
          puVar11 = (undefined8 *)&stack0xfffffffffffffe08;
          for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar11 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
          }
          o.type = 1;
          o.m[0] = in_stack_fffffffffffffe08[0];
          o.m[1] = in_stack_fffffffffffffe08[1];
          o.m[2] = in_stack_fffffffffffffe08[2];
          o.m[3] = in_stack_fffffffffffffe08[3];
          o.m[4] = in_stack_fffffffffffffe08[4];
          o.m[5] = in_stack_fffffffffffffe08[5];
          o.m[6] = in_stack_fffffffffffffe08[6];
          o.m[7] = in_stack_fffffffffffffe08[7];
          o.m[8] = in_stack_fffffffffffffe08[8];
          o.m[9] = in_stack_fffffffffffffe08[9];
          o.m[10] = in_stack_fffffffffffffe08[10];
          o.m[0xb] = in_stack_fffffffffffffe08[0xb];
          o.m[0xc] = in_stack_fffffffffffffe08[0xc];
          o.m[0xd] = in_stack_fffffffffffffe08[0xd];
          o.m[0xe] = in_stack_fffffffffffffe08[0xe];
          o.m[0xf] = in_stack_fffffffffffffe08[0xf];
          mat4::operator*((mat4 *)(storedProj.m + 0xf),this_00,o);
          pfVar8 = storedProj.m + 0xf;
          pmVar7 = this_00;
          for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
            pmVar7->m[0] = *pfVar8;
            pfVar8 = pfVar8 + (ulong)bVar15 * -2 + 1;
            pmVar7 = (mat4 *)((long)pmVar7 + (ulong)bVar15 * -8 + 4);
          }
          *(byte *)&this->m_matrixState = (byte)this->m_matrixState | 0x40;
          drawShadowQuad(this,*(uint *)((long)first + 8) + 8,*(uint *)((long)first + 0x10),
                         *(int *)((long)plVar3 + 0x34),local_d8,local_58,
                         (vec2)((ulong)(uint)(1.0 / local_c8) << 0x20),*(vec4 *)(plVar3 + 8));
          pfVar8 = local_1a8;
          for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
            this_00->m[0] = *pfVar8;
            pfVar8 = pfVar8 + (ulong)bVar15 * -2 + 1;
            this_00 = (mat4 *)((long)this_00 + (ulong)bVar15 * -8 + 4);
          }
          *(byte *)&this->m_matrixState = (byte)this->m_matrixState | 0x40;
          drawTextureQuad(this,*(uint *)((long)first + 8) + 0xc,*(uint *)((long)first + 0x14),1.0,
                          RGBA_32);
          this_01 = local_38;
          TexturePool::release(local_38,*(uint *)((long)first + 0x10));
          GVar5 = *(uint *)((long)first + 0x14);
          goto LAB_00122496;
        }
        break;
      default:
        if (cVar1 == 'B') {
          plVar3 = (long *)plVar3[9];
          local_58.x = *(float *)((long)first + 8);
          GVar5 = (**(code **)(*plVar3 + 0x20))(plVar3);
          format = (**(code **)(*plVar3 + 0x18))(plVar3);
          drawTextureQuad(this,(uint)local_58.x,GVar5,1.0,format);
        }
        else {
          if (cVar1 != 'A') break;
          drawColorQuad(this,*(uint *)((long)first + 8),*(vec4 *)((long)plVar3 + 0x44));
        }
        goto LAB_0012260d;
      }
      if ((uVar2 >> 0x1d & 1) == 0) {
        if (((cVar1 == 'C') &&
            ((fVar16 = *(float *)((long)plVar3 + 0x3c) - *(float *)((long)plVar3 + 0x34),
             fVar16 != 0.0 || (NAN(fVar16))))) &&
           ((*(float *)(plVar3 + 8) - *(float *)(plVar3 + 7) != 0.0 ||
            (NAN(*(float *)(plVar3 + 8) - *(float *)(plVar3 + 7)))))) {
          if (this->m_activeShader != (Program *)0x0) {
            iVar13 = (this->m_activeShader->super_OpenGLShaderProgram).m_attributeCount;
            local_58 = (vec2)last;
            glUseProgram(0);
            iVar14 = iVar13;
            if (iVar13 < 0) {
              do {
                glEnableVertexAttribArray(iVar14);
                iVar14 = iVar14 + 1;
              } while (iVar14 != 0);
            }
            if (0 < iVar13) {
              do {
                iVar13 = iVar13 + -1;
                glDisableVertexAttribArray(iVar13);
              } while (iVar13 != 0);
            }
            this->m_activeShader = (Program *)0x0;
            last = (Element *)local_58;
          }
          glBindBuffer(0x8892,0);
          (**(code **)(*plVar3 + 0x28))(plVar3);
          glBindBuffer(0x8892,this->m_texCoordBuffer);
          glVertexAttribPointer(1,2,0x1406,0,0,0);
          glBindBuffer(0x8892,this->m_vertexBuffer);
          glDisable(0xb71);
          glDisable(0xb90);
          glDepthMask(0);
          glEnable(0xbe2);
          glBlendFunc();
        }
      }
      else if ((uVar2 & 0x1fffffff) != 0) {
        lVar6 = 0x3f;
        if ((uVar2 & 0x1fffffff) != 0) {
          for (; ((ulong)uVar2 & 0x1fffffff) >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        pEVar12 = (Element *)((long)first + ((ulong)uVar2 & 0x1fffffff) * 0x20) + 1;
        std::
        __introsort_loop<rengine::OpenGLRenderer::Element*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  ((Element *)((long)first + 0x20),pEVar12,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<rengine::OpenGLRenderer::Element*,__gnu_cxx::__ops::_Iter_less_iter>
                  ((Element *)((long)first + 0x20),pEVar12);
      }
LAB_0012260d:
      *(byte *)((long)first + 0x1b) = *(byte *)((long)first + 0x1b) | 0x80;
LAB_00122612:
      first = (Element *)((long)first + 0x20);
    } while (first < last);
  }
  return;
}

Assistant:

inline void OpenGLRenderer::render(Element *first, Element *last)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "render " << first << " -> " << last - 1 << std::endl;

    // Check if we need to flatten something in this range
    if (m_numLayeredNodes > 0) {
        Element *e = first;
        // std::cout << space << "- checking layering for " << e << std::endl;
        while (e < last) {
            if (e->layered) {
                // std::cout << space << "- needs layering: " << e << std::endl;
                // ++recursion;
                renderToLayer(e);
                // --recursion;
                e = e + e->groupSize + 1;
            } else {
                ++e;
            }
        }
    }

    //
    glViewport(0, 0, m_surfaceSize.x, m_surfaceSize.y);

    Element *e = first;
    while (e < last) {
        // std::cout << space << "- render(normal) " << e << " node=(" << e->node << ") " << (e->completed ? "*done*" : "") << std::endl;
        if (e->completed) {
            ++e;
            continue;
        }

        if (e->node->type() == Node::RectangleNodeType) {
            // std::cout << space << "---> rect quad, vbo=" << e->vboOffset
            //      << " " << m_proj * m_vertices[e->vboOffset] << " " << m_proj * m_vertices[e->vboOffset+3] << std::endl;
            drawColorQuad(e->vboOffset, static_cast<RectangleNode *>(e->node)->color());
        } else if (e->node->type() == Node::TextureNodeType) {
            // std::cout << space << "---> texture quad, vbo=" << e->vboOffset << std::endl;
            const Texture *texture = static_cast<TextureNode *>(e->node)->texture();
            drawTextureQuad(e->vboOffset, texture->textureId(), 1.0f, texture->format());
        } else if (e->node->type() == Node::OpacityNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawTextureQuad(e->vboOffset, e->texture, static_cast<OpacityNode *>(e->node)->opacity());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ColorFilterNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawColorFilterQuad(e->vboOffset, e->texture, static_cast<ColorFilterNode *>(e->node)->colorMatrix());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::BlurNodeType && e->layered && e->texture) {
            // std::cout << space << "---> blur texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            BlurNode *blurNode = static_cast<BlurNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            // std::cout << " - radius: " << blurNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawBlurQuad(e->vboOffset + 8, e->texture, blurNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y));
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ShadowNodeType && e->layered && e->texture) {
            // std::cout << "---> shadow texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            ShadowNode *shadowNode = static_cast<ShadowNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            mat4 storedProj = m_proj;
            m_proj = m_proj * mat4::translate2D(std::round(shadowNode->offset().x), std::round(shadowNode->offset().y));
            m_matrixState |= UpdateShadowProgram;
            // std::cout << " - radius: " << shadowNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawShadowQuad(e->vboOffset + 8, e->texture, shadowNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y), shadowNode->color());
            m_proj = storedProj;
            m_matrixState |= UpdateShadowProgram;
            drawTextureQuad(e->vboOffset + 12, e->sourceTexture);
            m_texturePool.release(e->texture);
            m_texturePool.release(e->sourceTexture);
        } else if (e->projection) {
            std::sort(e + 1, e + e->groupSize + 1);
            // std::cout << space << "---> projection, sorting range: " << (e+1) << " -> " << (e+e->groupSize) << std::endl;
        } else if (e->node->type() == Node::RenderNodeType) {
            RenderNode *rn = static_cast<RenderNode *>(e->node);
            if (rn->width() != 0 && rn->height() != 0) {
                activateShader(0);
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                rn->render();
                setDefaultOpenGLState();
            }
        }

        e->completed = true;
        ++e;
    }
}